

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_aux.cpp
# Opt level: O0

void skiwi::save_before_foreign_call(asmcode *code)

{
  operand local_b0 [3];
  operation local_a4;
  operand local_a0 [3];
  operation local_94;
  operand local_90 [3];
  operation local_84;
  operand local_80 [3];
  operation local_74;
  operand local_70 [3];
  operation local_64;
  operand local_60 [3];
  operation local_54;
  operand local_50 [3];
  operation local_44;
  operand local_40 [3];
  operation local_34;
  operand local_30 [3];
  operation local_24 [2];
  operand local_1c [2];
  operation local_14;
  asmcode *local_10;
  asmcode *code_local;
  
  local_14 = SUB;
  local_1c[1] = 0xf;
  local_1c[0] = NUMBER;
  local_24[1] = 0x40;
  local_10 = code;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_14,local_1c + 1,local_1c,(int *)(local_24 + 1));
  local_24[0] = MOV;
  local_30[2] = 0x1f;
  local_30[1] = 0;
  local_30[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (local_10,local_24,local_30 + 2,(int *)(local_30 + 1),local_30);
  local_34 = MOV;
  local_40[2] = 0x1f;
  local_40[1] = 8;
  local_40[0] = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (local_10,&local_34,local_40 + 2,(int *)(local_40 + 1),local_40);
  local_44 = MOV;
  local_50[2] = 0x1f;
  local_50[1] = 0x10;
  local_50[0] = RDX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (local_10,&local_44,local_50 + 2,(int *)(local_50 + 1),local_50);
  local_54 = MOV;
  local_60[2] = 0x1f;
  local_60[1] = 0x18;
  local_60[0] = RSI;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (local_10,&local_54,local_60 + 2,(int *)(local_60 + 1),local_60);
  local_64 = MOV;
  local_70[2] = 0x1f;
  local_70[1] = 0x20;
  local_70[0] = RDI;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (local_10,&local_64,local_70 + 2,(int *)(local_70 + 1),local_70);
  local_74 = MOV;
  local_80[2] = 0x1f;
  local_80[1] = 0x28;
  local_80[0] = R8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (local_10,&local_74,local_80 + 2,(int *)(local_80 + 1),local_80);
  local_84 = MOV;
  local_90[2] = 0x1f;
  local_90[1] = 0x30;
  local_90[0] = R9;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (local_10,&local_84,local_90 + 2,(int *)(local_90 + 1),local_90);
  local_94 = MOV;
  local_a0[2] = 0x1f;
  local_a0[1] = 0x38;
  local_a0[0] = R10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (local_10,&local_94,local_a0 + 2,(int *)(local_a0 + 1),local_a0);
  local_a4 = MOV;
  local_b0[2] = 0x23;
  local_b0[1] = 0xf0;
  local_b0[0] = R13;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (local_10,&local_a4,local_b0 + 2,(int *)(local_b0 + 1),local_b0);
  return;
}

Assistant:

void save_before_foreign_call(asmcode& code)
  {
  /*
  sub rsp, CELLS(8)
  mov [rsp + CELLS(0)], rbx
  mov [rsp + CELLS(1)], rcx
  mov [rsp + CELLS(2)], rdx
  mov [rsp + CELLS(3)], rsi
  mov [rsp + CELLS(4)], rdi
  mov [rsp + CELLS(5)], r8
  mov [rsp + CELLS(6)], r9
  mov [rsp + CELLS(7)], r10
  */
  code.add(asmcode::SUB, asmcode::RSP, asmcode::NUMBER, CELLS(8));
  code.add(asmcode::MOV, asmcode::MEM_RSP, CELLS(0), asmcode::RBX);
  code.add(asmcode::MOV, asmcode::MEM_RSP, CELLS(1), asmcode::RCX);
  code.add(asmcode::MOV, asmcode::MEM_RSP, CELLS(2), asmcode::RDX);
  code.add(asmcode::MOV, asmcode::MEM_RSP, CELLS(3), asmcode::RSI);
  code.add(asmcode::MOV, asmcode::MEM_RSP, CELLS(4), asmcode::RDI);
  code.add(asmcode::MOV, asmcode::MEM_RSP, CELLS(5), asmcode::R8);
  code.add(asmcode::MOV, asmcode::MEM_RSP, CELLS(6), asmcode::R9);
  code.add(asmcode::MOV, asmcode::MEM_RSP, CELLS(7), asmcode::R10);

  code.add(asmcode::MOV, STACK, STACK_REGISTER); // We save the current stack position in the context, so that any load or eval functions start from the correct stack position.
                                                 // This is important for the garbage collector.
  }